

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

string * __thiscall
google::protobuf::(anonymous_namespace)::ComparisonTest::Run_abi_cxx11_
          (string *__return_storage_ptr__,void *this,Message *msg1,Message *msg2)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  FieldDescriptor *key;
  AlphaNum *in_R8;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  string local_290;
  string local_270;
  AlphaNum local_240;
  undefined1 local_210 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_208;
  MessageDifferencer local_1e0;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  util::MessageDifferencer::MessageDifferencer(&local_1e0);
  util::MessageDifferencer::ReportDifferencesToString(&local_1e0,__return_storage_ptr__);
  if (*(char *)((long)this + 0x1090) == '\x01') {
    util::MessageDifferencer::set_message_field_comparison(&local_1e0,EQUIVALENT);
  }
  if (*(long *)((long)this + 0x1100) != 0) {
    pFVar2 = protobuf::anon_unknown_0::GetFieldDescriptor(msg1,(string *)((long)this + 0x10f8));
    util::MessageDifferencer::IgnoreField(&local_1e0,pFVar2);
  }
  if (*(char *)((long)this + 0x1091) == '\x01') {
    util::MessageDifferencer::set_repeated_field_comparison(&local_1e0,AS_SET);
  }
  if (*(long *)((long)this + 0x10a0) != 0) {
    pFVar2 = protobuf::anon_unknown_0::GetFieldDescriptor(msg1,(string *)((long)this + 0x1098));
    util::MessageDifferencer::TreatAsSet(&local_1e0,pFVar2);
  }
  if ((*(long *)((long)this + 0x10c0) != 0) && (*(long *)((long)this + 0x10e0) != 0)) {
    pFVar2 = protobuf::anon_unknown_0::GetFieldDescriptor(msg1,(string *)((long)this + 0x10b8));
    local_270._M_string_length = *(size_type *)((long)this + 0x10b8);
    local_270._M_dataplus._M_p = *(pointer *)((long)this + 0x10c0);
    local_210 = (undefined1  [8])0x1;
    local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x13e023c;
    local_240.piece_._M_str = *(char **)((long)this + 0x10d8);
    local_240.piece_._M_len = *(undefined8 *)((long)this + 0x10e0);
    absl::lts_20250127::StrCat_abi_cxx11_
              (&local_290,(lts_20250127 *)&local_270,(AlphaNum *)local_210,&local_240,in_R8);
    key = protobuf::anon_unknown_0::GetFieldDescriptor(msg1,&local_290);
    util::MessageDifferencer::TreatAsMap(&local_1e0,pFVar2,key);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
  }
  bVar1 = util::MessageDifferencer::Compare(&local_1e0,msg1,msg2);
  local_210[0] = !bVar1;
  local_208 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_240);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_270,(internal *)local_210,(AssertionResult *)0x126d6fd,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xb9f,local_270._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_240);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_240.piece_._M_len != (long *)0x0) {
      (**(code **)(*(long *)local_240.piece_._M_len + 8))();
    }
  }
  if (local_208 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_208,local_208);
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1e0);
  return __return_storage_ptr__;
}

Assistant:

std::string Run(const Message& msg1, const Message& msg2) {
    std::string output;

    // Setup the comparison.
    util::MessageDifferencer differencer;
    differencer.ReportDifferencesToString(&output);

    if (use_equivalency_) {
      differencer.set_message_field_comparison(
          util::MessageDifferencer::EQUIVALENT);
    }

    SetSpecialFieldOption(msg1, &differencer);

    // Conduct the comparison.
    EXPECT_FALSE(differencer.Compare(msg1, msg2));

    return output;
  }